

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.cpp
# Opt level: O2

int __thiscall ncnn::Squeeze::forward(Squeeze *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int _w;
  int _w_00;
  int _h;
  int iVar1;
  int iVar2;
  Mat local_68;
  
  iVar2 = bottom_blob->dims;
  _w = bottom_blob->w;
  _w_00 = bottom_blob->h;
  _h = bottom_blob->c;
  Mat::operator=(top_blob,bottom_blob);
  iVar1 = this->squeeze_h;
  if ((_h == 1 && iVar2 == 3) && this->squeeze_c != 0) {
    if (_w_00 == 1 && iVar1 != 0) {
      Mat::reshape(&local_68,bottom_blob,_w,opt->blob_allocator);
      Mat::operator=(top_blob,&local_68);
    }
    else {
      Mat::reshape(&local_68,bottom_blob,_w,_w_00,opt->blob_allocator);
      Mat::operator=(top_blob,&local_68);
    }
  }
  else if (_w_00 == 1 && (1 < iVar2 && iVar1 != 0)) {
    if (_w == 1 && this->squeeze_w != 0) {
      Mat::reshape(&local_68,bottom_blob,_h,opt->blob_allocator);
      Mat::operator=(top_blob,&local_68);
    }
    else {
      Mat::reshape(&local_68,bottom_blob,_w,_h,opt->blob_allocator);
      Mat::operator=(top_blob,&local_68);
    }
  }
  else {
    if (_w != 1 || (iVar2 < 1 || this->squeeze_w == 0)) goto LAB_00121489;
    if (iVar1 == 0 || _w_00 != 1) {
      Mat::reshape(&local_68,bottom_blob,_w_00,_h,opt->blob_allocator);
      Mat::operator=(top_blob,&local_68);
    }
    else {
      Mat::reshape(&local_68,bottom_blob,_h,opt->blob_allocator);
      Mat::operator=(top_blob,&local_68);
    }
  }
  Mat::~Mat(&local_68);
LAB_00121489:
  if ((top_blob->data == (void *)0x0) || (iVar2 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
    iVar2 = -100;
  }
  return iVar2;
}

Assistant:

int Squeeze::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    top_blob = bottom_blob;

    if (squeeze_c && dims == 3 && channels == 1)
    {
        if (squeeze_h && h == 1)
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        else
            top_blob = bottom_blob.reshape(w, h, opt.blob_allocator);
    }
    else if (squeeze_h && dims >= 2 && h == 1)
    {
        if (squeeze_w && w == 1)
            top_blob = bottom_blob.reshape(channels, opt.blob_allocator);
        else
            top_blob = bottom_blob.reshape(w, channels, opt.blob_allocator);
    }
    else if (squeeze_w && dims >= 1 && w == 1)
    {
        if (squeeze_h && h == 1)
            top_blob = bottom_blob.reshape(channels, opt.blob_allocator);
        else
            top_blob = bottom_blob.reshape(h, channels, opt.blob_allocator);
    }

    if (top_blob.empty())
        return -100;

    return 0;
}